

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Quantize_x86_avx512::forward
          (Quantize_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  long in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar2;
  Mat scale_data_q_2;
  char *s8ptr_2;
  float *ptr_6;
  int q_2;
  Mat scale_data_q_1;
  char *s8ptr3_1;
  char *s8ptr2_1;
  char *s8ptr1_3;
  char *s8ptr0_3;
  float *ptr_5;
  int q_1;
  Mat scale_data_q;
  char *s8ptr1_2;
  char *s8ptr0_2;
  float *ptr_4;
  int q;
  size_t out_elemsize_2;
  int outc;
  int out_elempack_2;
  Mat scale_data_i_2;
  char *s8ptr_1;
  float *ptr_3;
  int i_3;
  Mat scale_data_i_1;
  char *s8ptr3;
  char *s8ptr2;
  char *s8ptr1_1;
  char *s8ptr0_1;
  float *ptr_2;
  int i_2;
  Mat scale_data_i;
  char *s8ptr1;
  char *s8ptr0;
  float *ptr_1;
  int i_1;
  size_t out_elemsize_1;
  int outh;
  int out_elempack_1;
  int size;
  char *s8ptr;
  float *ptr;
  int i;
  int ii;
  int nn_w;
  int wp;
  size_t out_elemsize;
  int outw;
  int out_elempack;
  int elempack;
  int channels;
  int h;
  int w;
  int dims;
  Mat *m_8;
  Mat *m_3;
  Mat *m;
  Mat *m_9;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_2;
  Mat *m_1;
  Allocator *in_stack_ffffffffffffeac0;
  size_t in_stack_ffffffffffffeac8;
  size_t in_stack_ffffffffffffead0;
  undefined8 in_stack_ffffffffffffead8;
  Mat *in_stack_ffffffffffffeae0;
  Allocator *in_stack_ffffffffffffeb40;
  Mat *in_stack_ffffffffffffeb78;
  char *in_stack_ffffffffffffeb80;
  char *in_stack_ffffffffffffeb88;
  char *in_stack_ffffffffffffeb90;
  char *in_stack_ffffffffffffeb98;
  float *in_stack_ffffffffffffeba0;
  undefined8 in_stack_ffffffffffffebe0;
  Mat *in_stack_ffffffffffffebe8;
  char *in_stack_ffffffffffffebf0;
  char *in_stack_ffffffffffffebf8;
  float *in_stack_ffffffffffffec00;
  void **in_stack_ffffffffffffec38;
  Mat *in_stack_ffffffffffffec40;
  char *in_stack_ffffffffffffec48;
  float *in_stack_ffffffffffffec50;
  void *local_1298;
  int *local_1290;
  undefined8 local_1288;
  undefined4 local_1280;
  long *local_1278;
  undefined4 local_1270;
  uint local_126c;
  undefined4 local_1268;
  undefined4 local_1264;
  undefined4 local_1260;
  long local_1258;
  undefined8 local_1250;
  undefined8 local_1248;
  undefined8 local_1240;
  undefined4 local_1238;
  long local_1230;
  undefined4 local_1228;
  undefined4 local_1224;
  undefined4 local_1220;
  undefined4 local_121c;
  undefined4 local_1218;
  undefined8 local_1210;
  long local_1208;
  undefined8 local_1200;
  undefined8 local_11f8;
  undefined8 local_11f0;
  undefined4 local_11e8;
  long local_11e0;
  undefined4 local_11d8;
  undefined4 local_11d4;
  undefined4 local_11d0;
  undefined4 local_11cc;
  undefined4 local_11c8;
  undefined8 local_11c0;
  long local_11b8;
  int local_11ac;
  void *local_11a8;
  int *local_11a0;
  undefined8 local_1198;
  undefined4 local_1190;
  long *local_1188;
  undefined4 local_1180;
  uint local_117c;
  undefined4 local_1178;
  undefined4 local_1174;
  undefined4 local_1170;
  long local_1168;
  undefined8 local_1160;
  undefined8 local_1158;
  undefined8 local_1150;
  undefined4 local_1148;
  long local_1140;
  undefined4 local_1138;
  undefined4 local_1134;
  undefined4 local_1130;
  undefined4 local_112c;
  undefined4 local_1128;
  undefined8 local_1120;
  long local_1118;
  Mat local_1110;
  char *local_10c8;
  float local_10c0 [8];
  long local_10a0;
  undefined4 local_1098;
  undefined4 local_1094;
  undefined4 local_1090;
  undefined4 local_108c;
  undefined4 local_1088;
  undefined8 local_1080;
  long local_1078;
  undefined8 local_1070;
  undefined8 local_1068;
  undefined8 local_1060;
  undefined4 local_1058;
  long local_1050;
  undefined4 local_1048;
  undefined4 local_1044;
  undefined4 local_1040;
  undefined4 local_103c;
  undefined4 local_1038;
  undefined8 local_1030;
  long local_1028;
  undefined8 local_1020;
  undefined8 local_1018;
  undefined8 local_1010;
  undefined4 local_1008;
  long local_1000;
  undefined4 local_ff8;
  undefined4 local_ff4;
  undefined4 local_ff0;
  undefined4 local_fec;
  undefined4 local_fe8;
  undefined8 local_fe0;
  long local_fd8;
  int local_fcc;
  void *local_fc8;
  int *local_fc0;
  undefined8 local_fb8;
  undefined4 local_fb0;
  long *local_fa8;
  undefined4 local_fa0;
  uint local_f9c;
  undefined4 local_f98;
  undefined4 local_f94;
  undefined4 local_f90;
  long local_f88;
  Mat local_f80;
  char *local_f38;
  undefined8 local_f30;
  undefined8 local_f28;
  undefined8 local_f20;
  undefined4 local_f18;
  long local_f10;
  undefined4 local_f08;
  undefined4 local_f04;
  undefined4 local_f00;
  undefined4 local_efc;
  undefined4 local_ef8;
  undefined8 local_ef0;
  long local_ee8;
  undefined8 local_ee0;
  undefined8 local_ed8;
  undefined8 local_ed0;
  undefined4 local_ec8;
  long local_ec0;
  undefined4 local_eb8;
  undefined4 local_eb4;
  undefined4 local_eb0;
  undefined4 local_eac;
  undefined4 local_ea8;
  undefined8 local_ea0;
  long local_e98;
  int local_e8c;
  ulong local_e88;
  int local_e80;
  uint local_e7c;
  void *local_e78;
  int *local_e70;
  undefined8 local_e68;
  undefined4 local_e60;
  long *local_e58;
  undefined4 local_e50;
  uint local_e4c;
  undefined4 local_e48;
  undefined4 local_e44;
  undefined4 local_e40;
  long local_e38;
  long local_e30;
  long local_e28;
  int local_e1c;
  void *local_e18;
  int *local_e10;
  undefined8 local_e08;
  undefined4 local_e00;
  long *local_df8;
  undefined4 local_df0;
  uint local_dec;
  undefined4 local_de8;
  undefined4 local_de4;
  undefined4 local_de0;
  long local_dd8;
  long local_dd0;
  long local_dc8;
  long local_dc0;
  long local_db8;
  long local_db0;
  int local_da8;
  void *local_d98;
  int *local_d90;
  undefined8 local_d88;
  undefined4 local_d80;
  long *local_d78;
  undefined4 local_d70;
  uint local_d6c;
  undefined4 local_d68;
  undefined4 local_d64;
  undefined4 local_d60;
  long local_d58;
  long local_d50;
  long local_d48;
  long local_d40;
  int local_d34;
  ulong local_d30;
  int local_d28;
  uint local_d24;
  int local_d20;
  int local_d1c;
  long local_d18;
  long local_d10;
  int local_d08;
  int local_d04;
  int local_d00;
  int local_cfc [3];
  ulong local_cf0;
  int local_ce4;
  uint local_ce0;
  uint local_cdc;
  int local_cd8;
  int local_cd4;
  int local_cd0;
  int local_ccc;
  long local_cc8;
  long *local_cc0;
  long *local_cb8;
  long *local_ca0;
  long *local_c98;
  long *local_c90;
  undefined8 *local_c88;
  undefined8 *local_c80;
  undefined8 *local_c78;
  long *local_c70;
  undefined8 *local_c68;
  undefined8 *local_c60;
  Mat *local_c58;
  float *local_c50;
  undefined8 *local_c48;
  Mat *local_c40;
  undefined8 *local_c38;
  long *local_c30;
  int local_c24;
  long *local_c20;
  int local_c14;
  long *local_c10;
  int local_c04;
  long *local_c00;
  int local_bf4;
  long *local_bf0;
  int local_be4;
  long *local_be0;
  int local_bd4;
  long *local_bd0;
  int local_bc4;
  long *local_bc0;
  int local_bb4;
  long *local_bb0;
  int local_ba4;
  long *local_ba0;
  int local_b94;
  long *local_b90;
  uint local_b88;
  int local_b84;
  long *local_b80;
  void **local_b78;
  uint local_b70;
  int local_b6c;
  long *local_b68;
  void **local_b60;
  uint local_b58;
  int local_b54;
  long *local_b50;
  void **local_b48;
  uint local_b40;
  int local_b3c;
  long *local_b38;
  void **local_b30;
  uint local_b28;
  int local_b24;
  long *local_b20;
  void **local_b18;
  uint local_b10;
  int local_b0c;
  long *local_b08;
  void **local_b00;
  long *local_af8;
  void **local_af0;
  long *local_ae8;
  void **local_ae0;
  long *local_ad8;
  void **local_ad0;
  long *local_ac8;
  void **local_ac0;
  long *local_ab8;
  void **local_ab0;
  long *local_aa8;
  void **local_aa0;
  void **local_a98;
  void **local_a88;
  void **local_a78;
  undefined8 *local_a68;
  undefined8 *local_a58;
  Mat *local_a48;
  void **local_a38;
  undefined8 *local_a28;
  undefined8 *local_a18;
  float *local_a08;
  Mat *local_9f8;
  undefined8 *local_9e8;
  void **local_9d8;
  undefined8 *local_9c8;
  undefined8 *local_9b8;
  void **local_9a8;
  undefined1 local_995;
  int local_994;
  undefined8 *local_988;
  undefined1 local_975;
  int local_974;
  undefined8 *local_968;
  undefined1 local_955;
  int local_954;
  undefined8 *local_948;
  undefined1 local_935;
  int local_934;
  undefined8 *local_928;
  undefined1 local_915;
  int local_914;
  undefined8 *local_908;
  undefined1 local_8f5;
  int local_8f4;
  Mat *local_8e8;
  undefined1 local_8d5;
  int local_8d4;
  float *local_8c8;
  undefined1 local_8b5;
  int local_8b4;
  undefined8 *local_8a8;
  undefined1 local_895;
  int local_894;
  Mat *local_888;
  undefined1 local_875;
  int local_874;
  undefined8 *local_868;
  long *local_858;
  long *local_850;
  long *local_848;
  long *local_840;
  undefined4 local_834;
  undefined8 local_830;
  void *local_828;
  uint local_81c;
  void **local_818;
  long *local_810;
  undefined4 local_804;
  undefined8 local_800;
  void *local_7f8;
  uint local_7ec;
  void **local_7e8;
  long *local_7e0;
  undefined4 local_7d4;
  undefined8 local_7d0;
  void *local_7c8;
  uint local_7bc;
  void **local_7b8;
  long *local_7b0;
  undefined4 local_7a4;
  undefined8 local_7a0;
  void *local_798;
  uint local_78c;
  void **local_788;
  long *local_780;
  undefined4 local_774;
  undefined8 local_770;
  void *local_768;
  uint local_75c;
  void **local_758;
  long *local_750;
  undefined4 local_744;
  undefined8 local_740;
  void *local_738;
  uint local_72c;
  void **local_728;
  int local_720;
  undefined4 local_71c;
  void **local_718;
  int local_710;
  undefined4 local_70c;
  void **local_708;
  int local_700;
  undefined4 local_6fc;
  void **local_6f8;
  int local_6f0;
  undefined4 local_6ec;
  void **local_6e8;
  int local_6e0;
  undefined4 local_6dc;
  void **local_6d8;
  int local_6d0;
  undefined4 local_6cc;
  void **local_6c8;
  int local_610;
  undefined4 local_60c;
  void **local_608;
  undefined8 *local_5e8;
  undefined8 *local_5c8;
  int local_5b0;
  undefined4 local_5ac;
  void **local_5a8;
  undefined8 *local_588;
  Mat *local_568;
  float *local_548;
  undefined8 *local_528;
  undefined8 *local_508;
  int local_4f0;
  undefined4 local_4ec;
  void **local_4e8;
  Mat *local_4c8;
  undefined8 *local_4a8;
  undefined8 *local_488;
  int local_470;
  undefined4 local_46c;
  void **local_468;
  int local_450;
  undefined4 local_44c;
  void **local_448;
  int in_stack_fffffffffffffbd0;
  
  local_ccc = (int)in_RSI[5];
  local_cd0 = *(int *)((long)in_RSI + 0x2c);
  local_cd4 = (int)in_RSI[6];
  local_cd8 = (int)in_RSI[7];
  local_cdc = *(uint *)(in_RSI + 3);
  local_cc8 = in_RCX;
  local_cc0 = in_RDX;
  local_cb8 = in_RSI;
  if (local_ccc == 1) {
    local_ce0 = 1;
    if (((*(byte *)(in_RCX + 0x27) & 1) != 0) &&
       (local_ce0 = 1, (int)(local_cd0 * local_cdc) % 8 == 0)) {
      local_ce0 = 8;
    }
    local_ce4 = (int)(local_cd0 * local_cdc) / (int)local_ce0;
    local_cf0 = (ulong)local_ce0;
    Mat::create(in_stack_ffffffffffffeae0,(int)((ulong)in_stack_ffffffffffffead8 >> 0x20),
                in_stack_ffffffffffffead0,(int)(in_stack_ffffffffffffeac8 >> 0x20),
                in_stack_ffffffffffffeac0);
    local_c90 = local_cc0;
    bVar2 = true;
    if (*local_cc0 != 0) {
      local_858 = local_cc0;
      bVar2 = local_cc0[8] * (long)(int)local_cc0[7] == 0;
    }
    if (bVar2) {
      return -100;
    }
    local_cfc[1] = 1;
    local_cfc[0] = local_cd0 / *(int *)(local_cc8 + 4);
    piVar1 = std::max<int>(local_cfc + 1,local_cfc);
    local_cfc[2] = *piVar1;
    local_d00 = (local_cd0 + local_cfc[2] + -1) / local_cfc[2];
    for (local_d04 = 0; local_d04 < local_d00; local_d04 = local_d04 + 1) {
      local_d08 = local_d04 * local_cfc[2];
      local_c70 = local_cb8;
      local_d10 = *local_cb8 + (long)(int)(local_d08 * local_cdc) * 4;
      local_c30 = local_cc0;
      local_d18 = *local_cc0 + (long)(int)(local_d08 * local_cdc);
      local_d20 = local_cd0 - local_d08;
      piVar1 = std::min<int>(&local_d20,local_cfc + 2);
      local_d1c = *piVar1 * local_cdc;
      quantize(in_stack_ffffffffffffec50,in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
               (int)((ulong)in_stack_ffffffffffffec38 >> 0x20),(int)in_stack_ffffffffffffec38);
    }
  }
  if (local_ccc == 2) {
    local_d24 = 1;
    if (((*(byte *)(local_cc8 + 0x27) & 1) != 0) &&
       (local_d24 = 1, (int)(local_cd4 * local_cdc) % 8 == 0)) {
      local_d24 = 8;
    }
    local_d28 = (int)(local_cd4 * local_cdc) / (int)local_d24;
    local_d30 = (ulong)local_d24;
    Mat::create(in_stack_ffffffffffffeae0,(int)((ulong)in_stack_ffffffffffffead8 >> 0x20),
                (int)in_stack_ffffffffffffead8,in_stack_ffffffffffffead0,
                (int)(in_stack_ffffffffffffeac8 >> 0x20),in_stack_ffffffffffffeac0);
    local_c98 = local_cc0;
    bVar2 = true;
    if (*local_cc0 != 0) {
      local_850 = local_cc0;
      bVar2 = local_cc0[8] * (long)(int)local_cc0[7] == 0;
    }
    if (bVar2) {
      return -100;
    }
    if ((local_cdc == 0x10) && (local_d24 == 8)) {
      for (local_d34 = 0; local_d34 < local_cd4; local_d34 = local_d34 + 1) {
        local_c00 = local_cb8;
        local_c04 = local_d34;
        local_d40 = *local_cb8 +
                    (long)*(int *)((long)local_cb8 + 0x2c) * (long)local_d34 * local_cb8[2];
        local_b94 = local_d34 << 1;
        local_b90 = local_cc0;
        local_d48 = *local_cc0 +
                    (long)*(int *)((long)local_cc0 + 0x2c) * (long)local_b94 * local_cc0[2];
        local_ba4 = local_d34 * 2 + 1;
        local_ba0 = local_cc0;
        local_d50 = *local_cc0 +
                    (long)*(int *)((long)local_cc0 + 0x2c) * (long)local_ba4 * local_cc0[2];
        if (*(int *)(in_RDI + 0xd0) < 2) {
          local_af8 = (long *)(in_RDI + 0xd8);
          local_af0 = &local_d98;
          local_d98 = (void *)*local_af8;
          local_d90 = *(int **)(in_RDI + 0xe0);
          local_d88 = *(undefined8 *)(in_RDI + 0xe8);
          local_d80 = *(undefined4 *)(in_RDI + 0xf0);
          local_d78 = *(long **)(in_RDI + 0xf8);
          local_d70 = *(undefined4 *)(in_RDI + 0x100);
          local_d6c = *(uint *)(in_RDI + 0x104);
          local_d68 = *(undefined4 *)(in_RDI + 0x108);
          local_d64 = *(undefined4 *)(in_RDI + 0x10c);
          local_d60 = *(undefined4 *)(in_RDI + 0x110);
          local_d58 = *(long *)(in_RDI + 0x118);
          local_6c8 = local_af0;
          if (local_d90 != (int *)0x0) {
            local_6cc = 1;
            LOCK();
            local_6d0 = *local_d90;
            *local_d90 = *local_d90 + 1;
            UNLOCK();
          }
        }
        else {
          local_b08 = (long *)(in_RDI + 0xd8);
          local_b0c = local_d34 * local_cdc;
          local_b00 = &local_d98;
          local_b10 = local_cdc;
          local_828 = (void *)(*local_b08 + (long)local_b0c * *(long *)(in_RDI + 0xe8));
          local_830 = *(undefined8 *)(in_RDI + 0xe8);
          local_834 = *(undefined4 *)(in_RDI + 0xf0);
          local_840 = *(long **)(in_RDI + 0xf8);
          local_818 = &local_d98;
          local_81c = local_cdc;
          local_d90 = (int *)0x0;
          local_d70 = 1;
          local_d6c = local_cdc;
          local_d68 = 1;
          local_d64 = 1;
          local_d60 = 1;
          local_d58 = (long)(int)local_cdc;
          local_d98 = local_828;
          local_d88 = local_830;
          local_d80 = local_834;
          local_d78 = local_840;
        }
        quantize_pack16to8(in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
                           in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8,
                           (int)((ulong)in_stack_ffffffffffffebe0 >> 0x20));
        local_a98 = &local_d98;
        if (local_d90 != (int *)0x0) {
          LOCK();
          in_stack_fffffffffffffbd0 = *local_d90;
          *local_d90 = *local_d90 + -1;
          UNLOCK();
          if (in_stack_fffffffffffffbd0 == 1) {
            if (local_d78 == (long *)0x0) {
              if (local_d98 != (void *)0x0) {
                free(local_d98);
              }
            }
            else {
              (**(code **)(*local_d78 + 0x18))(local_d78,local_d98);
            }
          }
        }
        local_d98 = (void *)0x0;
        local_d88 = 0;
        local_d80 = 0;
        local_d70 = 0;
        local_d6c = 0;
        local_d68 = 0;
        local_d64 = 0;
        local_d60 = 0;
        local_d58 = 0;
        local_d90 = (int *)0x0;
      }
    }
    if ((local_cdc == 4) && (local_d24 == 1)) {
      for (local_da8 = 0; local_da8 < local_cd4; local_da8 = local_da8 + 1) {
        local_c10 = local_cb8;
        local_c14 = local_da8;
        local_db0 = *local_cb8 +
                    (long)*(int *)((long)local_cb8 + 0x2c) * (long)local_da8 * local_cb8[2];
        local_bb4 = local_da8 << 2;
        local_bb0 = local_cc0;
        local_db8 = *local_cc0 +
                    (long)*(int *)((long)local_cc0 + 0x2c) * (long)local_bb4 * local_cc0[2];
        local_bc4 = local_da8 * 4 + 1;
        local_bc0 = local_cc0;
        local_dc0 = *local_cc0 +
                    (long)*(int *)((long)local_cc0 + 0x2c) * (long)local_bc4 * local_cc0[2];
        local_bd4 = local_da8 * 4 + 2;
        local_bd0 = local_cc0;
        local_dc8 = *local_cc0 +
                    (long)*(int *)((long)local_cc0 + 0x2c) * (long)local_bd4 * local_cc0[2];
        local_be4 = local_da8 * 4 + 3;
        local_be0 = local_cc0;
        local_dd0 = *local_cc0 +
                    (long)*(int *)((long)local_cc0 + 0x2c) * (long)local_be4 * local_cc0[2];
        if (*(int *)(in_RDI + 0xd0) < 2) {
          local_ae8 = (long *)(in_RDI + 0xd8);
          local_ae0 = &local_e18;
          local_e18 = (void *)*local_ae8;
          local_e10 = *(int **)(in_RDI + 0xe0);
          local_e08 = *(undefined8 *)(in_RDI + 0xe8);
          local_e00 = *(undefined4 *)(in_RDI + 0xf0);
          local_df8 = *(long **)(in_RDI + 0xf8);
          local_df0 = *(undefined4 *)(in_RDI + 0x100);
          local_dec = *(uint *)(in_RDI + 0x104);
          local_de8 = *(undefined4 *)(in_RDI + 0x108);
          local_de4 = *(undefined4 *)(in_RDI + 0x10c);
          local_de0 = *(undefined4 *)(in_RDI + 0x110);
          local_dd8 = *(long *)(in_RDI + 0x118);
          local_6d8 = local_ae0;
          if (local_e10 != (int *)0x0) {
            local_6dc = 1;
            LOCK();
            local_6e0 = *local_e10;
            *local_e10 = *local_e10 + 1;
            UNLOCK();
          }
        }
        else {
          local_b20 = (long *)(in_RDI + 0xd8);
          local_b24 = local_da8 * local_cdc;
          local_b18 = &local_e18;
          local_b28 = local_cdc;
          local_7f8 = (void *)(*local_b20 + (long)local_b24 * *(long *)(in_RDI + 0xe8));
          local_800 = *(undefined8 *)(in_RDI + 0xe8);
          local_804 = *(undefined4 *)(in_RDI + 0xf0);
          local_810 = *(long **)(in_RDI + 0xf8);
          local_7e8 = &local_e18;
          local_7ec = local_cdc;
          local_e10 = (int *)0x0;
          local_df0 = 1;
          local_dec = local_cdc;
          local_de8 = 1;
          local_de4 = 1;
          local_de0 = 1;
          local_dd8 = (long)(int)local_cdc;
          local_e18 = local_7f8;
          local_e08 = local_800;
          local_e00 = local_804;
          local_df8 = local_810;
        }
        quantize_pack4to1(in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98,
                          in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
                          in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
                          in_stack_fffffffffffffbd0);
        local_a88 = &local_e18;
        local_448 = local_a88;
        if (local_e10 != (int *)0x0) {
          local_44c = 0xffffffff;
          LOCK();
          local_450 = *local_e10;
          *local_e10 = *local_e10 + -1;
          UNLOCK();
          if (local_450 == 1) {
            if (local_df8 == (long *)0x0) {
              if (local_e18 != (void *)0x0) {
                free(local_e18);
              }
            }
            else {
              (**(code **)(*local_df8 + 0x18))(local_df8,local_e18);
            }
          }
        }
        local_e18 = (void *)0x0;
        local_e08 = 0;
        local_e00 = 0;
        local_df0 = 0;
        local_dec = 0;
        local_de8 = 0;
        local_de4 = 0;
        local_de0 = 0;
        local_dd8 = 0;
        local_e10 = (int *)0x0;
      }
    }
    if (local_cdc == local_d24) {
      for (local_e1c = 0; local_e1c < local_cd4; local_e1c = local_e1c + 1) {
        local_c20 = local_cb8;
        local_c24 = local_e1c;
        local_e28 = *local_cb8 +
                    (long)*(int *)((long)local_cb8 + 0x2c) * (long)local_e1c * local_cb8[2];
        local_bf0 = local_cc0;
        local_bf4 = local_e1c;
        local_e30 = *local_cc0 +
                    (long)*(int *)((long)local_cc0 + 0x2c) * (long)local_e1c * local_cc0[2];
        if (*(int *)(in_RDI + 0xd0) < 2) {
          local_ad8 = (long *)(in_RDI + 0xd8);
          local_ad0 = &local_e78;
          local_e78 = (void *)*local_ad8;
          local_e70 = *(int **)(in_RDI + 0xe0);
          local_e68 = *(undefined8 *)(in_RDI + 0xe8);
          local_e60 = *(undefined4 *)(in_RDI + 0xf0);
          local_e58 = *(long **)(in_RDI + 0xf8);
          local_e50 = *(undefined4 *)(in_RDI + 0x100);
          local_e4c = *(uint *)(in_RDI + 0x104);
          local_e48 = *(undefined4 *)(in_RDI + 0x108);
          local_e44 = *(undefined4 *)(in_RDI + 0x10c);
          local_e40 = *(undefined4 *)(in_RDI + 0x110);
          local_e38 = *(long *)(in_RDI + 0x118);
          local_6e8 = local_ad0;
          if (local_e70 != (int *)0x0) {
            local_6ec = 1;
            LOCK();
            local_6f0 = *local_e70;
            *local_e70 = *local_e70 + 1;
            UNLOCK();
          }
        }
        else {
          local_b38 = (long *)(in_RDI + 0xd8);
          local_b3c = local_e1c * local_cdc;
          local_b30 = &local_e78;
          local_b40 = local_cdc;
          local_7c8 = (void *)(*local_b38 + (long)local_b3c * *(long *)(in_RDI + 0xe8));
          local_7d0 = *(undefined8 *)(in_RDI + 0xe8);
          local_7d4 = *(undefined4 *)(in_RDI + 0xf0);
          local_7e0 = *(long **)(in_RDI + 0xf8);
          local_7b8 = &local_e78;
          local_7bc = local_cdc;
          local_e70 = (int *)0x0;
          local_e50 = 1;
          local_e4c = local_cdc;
          local_e48 = 1;
          local_e44 = 1;
          local_e40 = 1;
          local_e38 = (long)(int)local_cdc;
          local_e78 = local_7c8;
          local_e68 = local_7d0;
          local_e60 = local_7d4;
          local_e58 = local_7e0;
        }
        quantize(in_stack_ffffffffffffec50,in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                 (int)((ulong)in_stack_ffffffffffffec38 >> 0x20),(int)in_stack_ffffffffffffec38);
        local_a78 = &local_e78;
        local_468 = local_a78;
        if (local_e70 != (int *)0x0) {
          local_46c = 0xffffffff;
          LOCK();
          local_470 = *local_e70;
          *local_e70 = *local_e70 + -1;
          UNLOCK();
          if (local_470 == 1) {
            if (local_e58 == (long *)0x0) {
              if (local_e78 != (void *)0x0) {
                free(local_e78);
              }
            }
            else {
              (**(code **)(*local_e58 + 0x18))(local_e58,local_e78);
            }
          }
        }
        local_e78 = (void *)0x0;
        local_e68 = 0;
        local_e60 = 0;
        local_e50 = 0;
        local_e4c = 0;
        local_e48 = 0;
        local_e44 = 0;
        local_e40 = 0;
        local_e38 = 0;
        local_e70 = (int *)0x0;
      }
    }
  }
  if (local_ccc == 3) {
    local_e7c = 1;
    if (((*(byte *)(local_cc8 + 0x27) & 1) != 0) &&
       (local_e7c = 1, (int)(local_cd8 * local_cdc) % 8 == 0)) {
      local_e7c = 8;
    }
    local_e80 = (int)(local_cd8 * local_cdc) / (int)local_e7c;
    local_e88 = (ulong)local_e7c;
    Mat::create(in_stack_ffffffffffffeae0,(int)((ulong)in_stack_ffffffffffffead8 >> 0x20),
                (int)in_stack_ffffffffffffead8,(int)(in_stack_ffffffffffffead0 >> 0x20),
                in_stack_ffffffffffffeac8,(int)((ulong)in_stack_ffffffffffffeac0 >> 0x20),
                in_stack_ffffffffffffeb40);
    local_ca0 = local_cc0;
    bVar2 = true;
    if (*local_cc0 != 0) {
      local_848 = local_cc0;
      bVar2 = local_cc0[8] * (long)(int)local_cc0[7] == 0;
    }
    if (bVar2) {
      return -100;
    }
    if ((local_cdc == 0x10) && (local_e7c == 8)) {
      for (local_e8c = 0; local_e8c < local_cd8; local_e8c = local_e8c + 1) {
        local_948 = &local_ee0;
        local_e98 = *local_cb8 + local_cb8[8] * (long)local_e8c * local_cb8[2];
        local_ec0 = local_cb8[4];
        local_c78 = &local_ee0;
        local_a68 = &local_ee0;
        local_874 = local_e8c << 1;
        local_868 = &local_f30;
        local_ee8 = *local_cc0 + local_cc0[8] * (long)local_874 * local_cc0[2];
        local_f10 = local_cc0[4];
        local_c38 = &local_f30;
        local_a58 = &local_f30;
        local_894 = local_e8c * 2 + 1;
        local_888 = &local_f80;
        in_stack_ffffffffffffec48 =
             (char *)(*local_cc0 + local_cc0[8] * (long)local_894 * local_cc0[2]);
        local_f80.allocator = (Allocator *)local_cc0[4];
        local_c40 = &local_f80;
        in_stack_ffffffffffffec40 = &local_f80;
        local_ea8 = 0;
        local_eac = 0;
        local_eb0 = 0;
        local_eb4 = 0;
        local_ec8 = 0;
        local_ed0 = 0;
        local_ed8 = 0;
        local_ee0 = 0;
        local_ef8 = 0;
        local_efc = 0;
        local_f00 = 0;
        local_f04 = 0;
        local_f18 = 0;
        local_f20 = 0;
        local_f28 = 0;
        local_f30 = 0;
        local_875 = 1;
        local_895 = 1;
        local_954 = local_e8c;
        local_955 = 1;
        local_ea0 = 0;
        local_eb8 = 0;
        local_ef0 = 0;
        local_f08 = 0;
        local_f80.data = (void *)0x0;
        local_f80.elemsize = 0;
        local_f80.elempack = 0;
        local_f80.dims = 0;
        local_f80.w = 0;
        local_f80.h = 0;
        local_f80.d = 0;
        local_f80.c = 0;
        local_f80.cstep = 0;
        local_f80.refcount = (int *)0x0;
        if (*(int *)(in_RDI + 0xd0) < 2) {
          local_ac8 = (long *)(in_RDI + 0xd8);
          local_ac0 = &local_fc8;
          local_fc8 = (void *)*local_ac8;
          local_fc0 = *(int **)(in_RDI + 0xe0);
          local_fb8 = *(undefined8 *)(in_RDI + 0xe8);
          local_fb0 = *(undefined4 *)(in_RDI + 0xf0);
          local_fa8 = *(long **)(in_RDI + 0xf8);
          local_fa0 = *(undefined4 *)(in_RDI + 0x100);
          local_f9c = *(uint *)(in_RDI + 0x104);
          local_f98 = *(undefined4 *)(in_RDI + 0x108);
          local_f94 = *(undefined4 *)(in_RDI + 0x10c);
          local_f90 = *(undefined4 *)(in_RDI + 0x110);
          local_f88 = *(long *)(in_RDI + 0x118);
          local_6f8 = local_ac0;
          if (local_fc0 != (int *)0x0) {
            local_6fc = 1;
            LOCK();
            local_700 = *local_fc0;
            *local_fc0 = *local_fc0 + 1;
            UNLOCK();
          }
        }
        else {
          local_b50 = (long *)(in_RDI + 0xd8);
          local_b54 = local_e8c * local_cdc;
          local_b48 = &local_fc8;
          local_b58 = local_cdc;
          local_798 = (void *)(*local_b50 + (long)local_b54 * *(long *)(in_RDI + 0xe8));
          local_7a0 = *(undefined8 *)(in_RDI + 0xe8);
          local_7a4 = *(undefined4 *)(in_RDI + 0xf0);
          local_7b0 = *(long **)(in_RDI + 0xf8);
          in_stack_ffffffffffffec38 = &local_fc8;
          local_78c = local_cdc;
          local_fc0 = (int *)0x0;
          local_fa0 = 1;
          local_f9c = local_cdc;
          local_f98 = 1;
          local_f94 = 1;
          local_f90 = 1;
          local_f88 = (long)(int)local_cdc;
          local_788 = in_stack_ffffffffffffec38;
          local_fc8 = local_798;
          local_fb8 = local_7a0;
          local_fb0 = local_7a4;
          local_fa8 = local_7b0;
        }
        local_f38 = in_stack_ffffffffffffec48;
        local_a48 = in_stack_ffffffffffffec40;
        local_4c8 = in_stack_ffffffffffffec40;
        local_4a8 = local_a58;
        local_488 = local_a68;
        quantize_pack16to8(in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
                           in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8,
                           (int)((ulong)in_stack_ffffffffffffebe0 >> 0x20));
        local_a38 = &local_fc8;
        local_4e8 = local_a38;
        if (local_fc0 != (int *)0x0) {
          local_4ec = 0xffffffff;
          LOCK();
          local_4f0 = *local_fc0;
          *local_fc0 = *local_fc0 + -1;
          UNLOCK();
          if (local_4f0 == 1) {
            if (local_fa8 == (long *)0x0) {
              if (local_fc8 != (void *)0x0) {
                free(local_fc8);
              }
            }
            else {
              (**(code **)(*local_fa8 + 0x18))(local_fa8,local_fc8);
            }
          }
        }
        local_fc8 = (void *)0x0;
        local_fb8 = 0;
        local_fb0 = 0;
        local_fa0 = 0;
        local_f9c = 0;
        local_f98 = 0;
        local_f94 = 0;
        local_f90 = 0;
        local_f88 = 0;
        local_fc0 = (int *)0x0;
      }
    }
    if ((local_cdc == 4) && (local_e7c == 1)) {
      for (local_fcc = 0; local_fcc < local_cd8; local_fcc = local_fcc + 1) {
        local_968 = &local_1020;
        local_fd8 = *local_cb8 + local_cb8[8] * (long)local_fcc * local_cb8[2];
        local_1000 = local_cb8[4];
        local_c80 = &local_1020;
        local_a28 = &local_1020;
        local_974 = local_fcc;
        local_975 = 1;
        local_1020 = 0;
        local_1010 = 0;
        local_1008 = 0;
        local_ff8 = 0;
        local_ff4 = 0;
        local_ff0 = 0;
        local_fec = 0;
        local_fe8 = 0;
        local_fe0 = 0;
        local_1018 = 0;
        local_8b4 = local_fcc << 2;
        local_8a8 = &local_1070;
        local_1028 = *local_cc0 + local_cc0[8] * (long)local_8b4 * local_cc0[2];
        local_1050 = local_cc0[4];
        local_c48 = &local_1070;
        local_a18 = &local_1070;
        local_8d4 = local_fcc * 4 + 1;
        local_8c8 = local_10c0;
        local_1078 = *local_cc0 + local_cc0[8] * (long)local_8d4 * local_cc0[2];
        local_10a0 = local_cc0[4];
        local_c50 = local_10c0;
        local_a08 = local_10c0;
        local_1038 = 0;
        local_103c = 0;
        local_1040 = 0;
        local_1044 = 0;
        local_1058 = 0;
        local_1060 = 0;
        local_1068 = 0;
        local_1070 = 0;
        local_8b5 = 1;
        local_8d5 = 1;
        local_1030 = 0;
        local_1048 = 0;
        local_10c0[0] = 0.0;
        local_10c0[1] = 0.0;
        local_10c0[4] = 0.0;
        local_10c0[5] = 0.0;
        local_10c0[6] = 0.0;
        local_1098 = 0;
        local_1094 = 0;
        local_1090 = 0;
        local_108c = 0;
        local_1088 = 0;
        local_1080 = 0;
        local_10c0[2] = 0.0;
        local_10c0[3] = 0.0;
        local_8f4 = local_fcc * 4 + 2;
        local_8e8 = &local_1110;
        local_10c8 = (char *)(*local_cc0 + local_cc0[8] * (long)local_8f4 * local_cc0[2]);
        local_1110.allocator = (Allocator *)local_cc0[4];
        local_c58 = &local_1110;
        local_9f8 = &local_1110;
        local_8f5 = 1;
        local_1110.data = (void *)0x0;
        local_1110.elemsize = 0;
        local_1110.elempack = 0;
        local_1110.dims = 0;
        local_1110.w = 0;
        local_1110.h = 0;
        local_1110.d = 0;
        local_1110.c = 0;
        local_1110.cstep = 0;
        local_1110.refcount = (int *)0x0;
        local_914 = local_fcc * 4 + 3;
        local_908 = &local_1160;
        local_1118 = *local_cc0 + local_cc0[8] * (long)local_914 * local_cc0[2];
        local_1140 = local_cc0[4];
        local_c60 = &local_1160;
        local_9e8 = &local_1160;
        local_915 = 1;
        local_1160 = 0;
        local_1150 = 0;
        local_1148 = 0;
        local_1138 = 0;
        local_1134 = 0;
        local_1130 = 0;
        local_112c = 0;
        local_1128 = 0;
        local_1120 = 0;
        local_1158 = 0;
        if (*(int *)(in_RDI + 0xd0) < 2) {
          local_ab8 = (long *)(in_RDI + 0xd8);
          local_ab0 = &local_11a8;
          local_11a8 = (void *)*local_ab8;
          local_11a0 = *(int **)(in_RDI + 0xe0);
          local_1198 = *(undefined8 *)(in_RDI + 0xe8);
          local_1190 = *(undefined4 *)(in_RDI + 0xf0);
          local_1188 = *(long **)(in_RDI + 0xf8);
          local_1180 = *(undefined4 *)(in_RDI + 0x100);
          local_117c = *(uint *)(in_RDI + 0x104);
          local_1178 = *(undefined4 *)(in_RDI + 0x108);
          local_1174 = *(undefined4 *)(in_RDI + 0x10c);
          local_1170 = *(undefined4 *)(in_RDI + 0x110);
          local_1168 = *(long *)(in_RDI + 0x118);
          local_708 = local_ab0;
          if (local_11a0 != (int *)0x0) {
            local_70c = 1;
            LOCK();
            local_710 = *local_11a0;
            *local_11a0 = *local_11a0 + 1;
            UNLOCK();
          }
        }
        else {
          local_b68 = (long *)(in_RDI + 0xd8);
          local_b6c = local_fcc * local_cdc;
          local_b60 = &local_11a8;
          local_b70 = local_cdc;
          local_768 = (void *)(*local_b68 + (long)local_b6c * *(long *)(in_RDI + 0xe8));
          local_770 = *(undefined8 *)(in_RDI + 0xe8);
          local_774 = *(undefined4 *)(in_RDI + 0xf0);
          local_780 = *(long **)(in_RDI + 0xf8);
          local_758 = &local_11a8;
          local_75c = local_cdc;
          local_11a0 = (int *)0x0;
          local_1180 = 1;
          local_117c = local_cdc;
          local_1178 = 1;
          local_1174 = 1;
          local_1170 = 1;
          local_1168 = (long)(int)local_cdc;
          local_11a8 = local_768;
          local_1198 = local_770;
          local_1190 = local_774;
          local_1188 = local_780;
        }
        local_588 = local_9e8;
        local_568 = local_9f8;
        local_548 = local_a08;
        local_528 = local_a18;
        local_508 = local_a28;
        quantize_pack4to1(local_a08,(char *)local_cc0,(char *)&local_1110,in_stack_ffffffffffffeb88,
                          local_10c8,local_9f8,in_stack_fffffffffffffbd0);
        local_9d8 = &local_11a8;
        local_5a8 = local_9d8;
        if (local_11a0 != (int *)0x0) {
          local_5ac = 0xffffffff;
          LOCK();
          local_5b0 = *local_11a0;
          *local_11a0 = *local_11a0 + -1;
          UNLOCK();
          if (local_5b0 == 1) {
            if (local_1188 == (long *)0x0) {
              if (local_11a8 != (void *)0x0) {
                free(local_11a8);
              }
            }
            else {
              (**(code **)(*local_1188 + 0x18))(local_1188,local_11a8);
            }
          }
        }
        local_11a8 = (void *)0x0;
        local_1198 = 0;
        local_1190 = 0;
        local_1180 = 0;
        local_117c = 0;
        local_1178 = 0;
        local_1174 = 0;
        local_1170 = 0;
        local_1168 = 0;
        local_11a0 = (int *)0x0;
      }
    }
    if (local_cdc == local_e7c) {
      for (local_11ac = 0; local_11ac < local_cd8; local_11ac = local_11ac + 1) {
        local_988 = &local_1200;
        local_11b8 = *local_cb8 + local_cb8[8] * (long)local_11ac * local_cb8[2];
        local_11e0 = local_cb8[4];
        local_c88 = &local_1200;
        local_9c8 = &local_1200;
        local_928 = &local_1250;
        local_1208 = *local_cc0 + local_cc0[8] * (long)local_11ac * local_cc0[2];
        local_1230 = local_cc0[4];
        local_c68 = &local_1250;
        local_9b8 = &local_1250;
        local_11c8 = 0;
        local_11cc = 0;
        local_11d0 = 0;
        local_11d4 = 0;
        local_11e8 = 0;
        local_11f0 = 0;
        local_11f8 = 0;
        local_1200 = 0;
        local_934 = local_11ac;
        local_935 = 1;
        local_994 = local_11ac;
        local_995 = 1;
        local_11c0 = 0;
        local_11d8 = 0;
        local_1250 = 0;
        local_1240 = 0;
        local_1238 = 0;
        local_1228 = 0;
        local_1224 = 0;
        local_1220 = 0;
        local_121c = 0;
        local_1218 = 0;
        local_1210 = 0;
        local_1248 = 0;
        if (*(int *)(in_RDI + 0xd0) < 2) {
          local_aa8 = (long *)(in_RDI + 0xd8);
          local_aa0 = &local_1298;
          local_1298 = (void *)*local_aa8;
          local_1290 = *(int **)(in_RDI + 0xe0);
          local_1288 = *(undefined8 *)(in_RDI + 0xe8);
          local_1280 = *(undefined4 *)(in_RDI + 0xf0);
          local_1278 = *(long **)(in_RDI + 0xf8);
          local_1270 = *(undefined4 *)(in_RDI + 0x100);
          local_126c = *(uint *)(in_RDI + 0x104);
          local_1268 = *(undefined4 *)(in_RDI + 0x108);
          local_1264 = *(undefined4 *)(in_RDI + 0x10c);
          local_1260 = *(undefined4 *)(in_RDI + 0x110);
          local_1258 = *(long *)(in_RDI + 0x118);
          local_718 = local_aa0;
          if (local_1290 != (int *)0x0) {
            local_71c = 1;
            LOCK();
            local_720 = *local_1290;
            *local_1290 = *local_1290 + 1;
            UNLOCK();
          }
        }
        else {
          local_b80 = (long *)(in_RDI + 0xd8);
          local_b84 = local_11ac * local_cdc;
          local_b78 = &local_1298;
          local_b88 = local_cdc;
          local_738 = (void *)(*local_b80 + (long)local_b84 * *(long *)(in_RDI + 0xe8));
          local_740 = *(undefined8 *)(in_RDI + 0xe8);
          local_744 = *(undefined4 *)(in_RDI + 0xf0);
          local_750 = *(long **)(in_RDI + 0xf8);
          local_728 = &local_1298;
          local_72c = local_cdc;
          local_1290 = (int *)0x0;
          local_1270 = 1;
          local_126c = local_cdc;
          local_1268 = 1;
          local_1264 = 1;
          local_1260 = 1;
          local_1258 = (long)(int)local_cdc;
          local_1298 = local_738;
          local_1288 = local_740;
          local_1280 = local_744;
          local_1278 = local_750;
        }
        local_5e8 = local_9b8;
        local_5c8 = local_9c8;
        quantize(in_stack_ffffffffffffec50,in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                 (int)((ulong)in_stack_ffffffffffffec38 >> 0x20),(int)in_stack_ffffffffffffec38);
        local_9a8 = &local_1298;
        local_608 = local_9a8;
        if (local_1290 != (int *)0x0) {
          local_60c = 0xffffffff;
          LOCK();
          local_610 = *local_1290;
          *local_1290 = *local_1290 + -1;
          UNLOCK();
          if (local_610 == 1) {
            if (local_1278 == (long *)0x0) {
              if (local_1298 != (void *)0x0) {
                free(local_1298);
              }
            }
            else {
              (**(code **)(*local_1278 + 0x18))(local_1278,local_1298);
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Quantize_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    if (dims == 1)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = w * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outw = w * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const float* ptr = (const float*)bottom_blob + i * elempack;
            signed char* s8ptr = (signed char*)top_blob + i * elempack;

            // assert scale_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            quantize(ptr, s8ptr, scale_data, size, 1);
        }
    }

    if (dims == 2)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = h * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outh = h * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 2);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 2 + 1);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_i, w);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = bottom_blob.row(i * 2);
                const float* ptr1 = bottom_blob.row(i * 2 + 1);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_i, w);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 4);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 4 + 1);
                signed char* s8ptr2 = top_blob.row<signed char>(i * 4 + 2);
                signed char* s8ptr3 = top_blob.row<signed char>(i * 4 + 3);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_i, w);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_i, w, elempack);
            }
        }
    }

    if (dims == 3)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = channels * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outc = channels * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 2);
                signed char* s8ptr1 = top_blob.channel(q * 2 + 1);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_q, w * h);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* ptr0 = bottom_blob.channel(q * 2);
                const float* ptr1 = bottom_blob.channel(q * 2 + 1);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_q, w * h);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 4);
                signed char* s8ptr1 = top_blob.channel(q * 4 + 1);
                signed char* s8ptr2 = top_blob.channel(q * 4 + 2);
                signed char* s8ptr3 = top_blob.channel(q * 4 + 3);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_q, w * h);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_q, w * h, elempack);
            }
        }
    }

    return 0;
}